

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::SpecparamSymbol::resolvePathPulse(SpecparamSymbol *this)

{
  string_view *this_00;
  Scope *pSVar1;
  bool bVar2;
  size_type __n;
  Symbol *pSVar3;
  SpecparamSymbol *this_01;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> terminalName;
  Scope *parent;
  SourceLocation loc;
  basic_string_view<char,_std::char_traits<char>_> path;
  anon_class_24_3_83a3a2c4 nameError;
  
  this->pathPulseResolved = true;
  if (this->isPathPulse == true) {
    pSVar1 = (this->super_ValueSymbol).super_Symbol.parentScope;
    this_00 = &(this->super_ValueSymbol).super_Symbol.name;
    bVar4._M_str = "PATHPULSE$";
    bVar4._M_len = 10;
    parent = pSVar1;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(this_00,bVar4);
    if (((bVar2) && (pSVar1->thisSym->kind == SpecifyBlock)) &&
       (path = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,10,0xffffffffffffffff), path._M_len != 0)) {
      loc = (SourceLocation)((long)(this->super_ValueSymbol).super_Symbol.location + 0xa0000000);
      nameError.loc = &loc;
      nameError.parent = &parent;
      nameError.path = &path;
      __n = std::basic_string_view<char,_std::char_traits<char>_>::find(nameError.path,'$',0);
      if (__n != 0xffffffffffffffff) {
        this_01 = (SpecparamSymbol *)&path;
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)this_01,0,__n);
        terminalName = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)this_01,
                                  __n + 1,0xffffffffffffffff);
        if (terminalName._M_len != 0 && bVar4._M_len != 0) {
          pSVar3 = resolvePathTerminal(this_01,bVar4,parent,loc,true);
          this->pathSource = pSVar3;
          pSVar3 = resolvePathTerminal(this_01,terminalName,parent,
                                       (SourceLocation)(bVar4._M_len * 0x10000000 + (long)loc),false
                                      );
          this->pathDest = pSVar3;
          return;
        }
      }
      resolvePathPulse::anon_class_24_3_83a3a2c4::operator()(&nameError);
    }
  }
  return;
}

Assistant:

void SpecparamSymbol::resolvePathPulse() const {
    pathPulseResolved = true;
    if (!isPathPulse)
        return;

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto prefix = "PATHPULSE$"sv;
    if (name.starts_with(prefix) && parent->asSymbol().kind == SymbolKind::SpecifyBlock) {
        auto path = name.substr(prefix.length());
        if (!path.empty()) {
            auto loc = location + prefix.length();
            auto nameError = [&] {
                parent->addDiag(diag::PathPulseInvalidPathName,
                                SourceRange{loc, loc + path.length()})
                    << path;
            };

            auto index = path.find('$');
            if (index == std::string_view::npos) {
                nameError();
                return;
            }

            auto source = path.substr(0, index);
            auto dest = path.substr(index + 1);
            if (source.empty() || dest.empty()) {
                nameError();
                return;
            }

            pathSource = resolvePathTerminal(source, *parent, loc,
                                             /* isSource */ true);
            pathDest = resolvePathTerminal(dest, *parent, loc + source.length(),
                                           /* isSource */ false);
        }
    }
}